

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# altrace_record.c
# Opt level: O0

void alGetListener3i(ALenum param,ALint *value1,ALint *value2,ALint *value3)

{
  int32 local_34;
  int32 local_30;
  int32 local_2c;
  ALint *value3_local;
  ALint *value2_local;
  ALint *value1_local;
  ALenum param_local;
  
  APILOCK();
  IO_ENTRYINFO(ALEE_alGetListener3i);
  IO_ENUM(param);
  IO_PTR(value1);
  IO_PTR(value2);
  IO_PTR(value3);
  (*REAL_alGetListener3i)(param,value1,value2,value3);
  if (value1 == (ALint *)0x0) {
    local_2c = 0;
  }
  else {
    local_2c = *value1;
  }
  IO_INT32(local_2c);
  if (value2 == (ALint *)0x0) {
    local_30 = 0;
  }
  else {
    local_30 = *value2;
  }
  IO_INT32(local_30);
  if (value3 == (ALint *)0x0) {
    local_34 = 0;
  }
  else {
    local_34 = *value3;
  }
  IO_INT32(local_34);
  check_al_error_events();
  check_al_async_states();
  APIUNLOCK();
  return;
}

Assistant:

void alGetListener3i(ALenum param, ALint *value1, ALint *value2, ALint *value3)
{
    IO_START(alGetListener3i);
    IO_ENUM(param);
    IO_PTR(value1);
    IO_PTR(value2);
    IO_PTR(value3);
    REAL_alGetListener3i(param, value1, value2, value3);
    IO_INT32(value1 ? *value1 : 0);
    IO_INT32(value2 ? *value2 : 0);
    IO_INT32(value3 ? *value3 : 0);
    IO_END();
}